

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

XMLElement * CMU462::Collada::ColladaParser::get_element(XMLElement *xml,string *query)

{
  undefined8 uVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  char *pcVar4;
  bool local_231;
  string local_228;
  allocator<char> local_201;
  string local_200 [8];
  string id;
  char *url;
  string local_1c8 [8];
  string token;
  XMLElement *e;
  stringstream ss;
  string *query_local;
  XMLElement *xml_local;
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&e,(string *)query,_Var2);
  token.field_2._8_8_ = xml;
  std::__cxx11::string::string(local_1c8);
  while( true ) {
    local_231 = false;
    if (token.field_2._8_8_ != 0) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&e,local_1c8,'/');
      local_231 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    }
    uVar1 = token.field_2._8_8_;
    if (local_231 == false) break;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    token.field_2._8_8_ = tinyxml2::XMLNode::FirstChildElement((XMLNode *)uVar1,pcVar4);
  }
  if ((token.field_2._8_8_ != 0) &&
     (id.field_2._8_8_ =
           (size_type)tinyxml2::XMLElement::Attribute(token.field_2._8_8_,"url",(char *)0x0),
     (char *)id.field_2._8_8_ != (char *)0x0)) {
    pcVar4 = (char *)(id.field_2._8_8_ + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_200,pcVar4,&local_201);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::string((string *)&local_228,local_200);
    token.field_2._8_8_ = uri_find(&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string(local_200);
  }
  uVar1 = token.field_2._8_8_;
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&e);
  return (XMLElement *)uVar1;
}

Assistant:

XMLElement* ColladaParser::get_element( XMLElement* xml, string query ) {

  stringstream ss (query);

  // find xml element
  XMLElement* e = xml; string token;
  while( e && getline(ss, token, '/') ) {
    e = e->FirstChildElement( token.c_str() );
  }

  // handle indirection
  if (e) {
		const char* url = e->Attribute("url");
    if (url) {
      string id = url + 1;
      e = uri_find(id);
    }
  }

  return e;
}